

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IsShadowTableOf(sqlite3 *db,Table *pTab,char *zName)

{
  char *__s;
  int *piVar1;
  code *UNRECOVERED_JUMPTABLE;
  int iVar2;
  size_t sVar3;
  HashElem *pHVar4;
  uint N;
  
  if (pTab->eTabType == '\x01') {
    __s = pTab->zName;
    if (__s == (char *)0x0) {
      N = 0;
    }
    else {
      sVar3 = strlen(__s);
      N = (uint)sVar3 & 0x3fffffff;
    }
    iVar2 = sqlite3_strnicmp(zName,__s,N);
    if ((iVar2 == 0) && (zName[N] == '_')) {
      pHVar4 = findElementWithHash(&db->aModule,*(pTab->u).vtab.azArg,(uint *)0x0);
      if (((undefined8 *)pHVar4->data != (undefined8 *)0x0) &&
         ((piVar1 = *pHVar4->data, 2 < *piVar1 &&
          (UNRECOVERED_JUMPTABLE = *(code **)(piVar1 + 0x2e), UNRECOVERED_JUMPTABLE != (code *)0x0))
         )) {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(zName + (ulong)N + 1);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsShadowTableOf(sqlite3 *db, Table *pTab, const char *zName){
  int nName;                    /* Length of zName */
  Module *pMod;                 /* Module for the virtual table */

  if( !IsVirtual(pTab) ) return 0;
  nName = sqlite3Strlen30(pTab->zName);
  if( sqlite3_strnicmp(zName, pTab->zName, nName)!=0 ) return 0;
  if( zName[nName]!='_' ) return 0;
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->u.vtab.azArg[0]);
  if( pMod==0 ) return 0;
  if( pMod->pModule->iVersion<3 ) return 0;
  if( pMod->pModule->xShadowName==0 ) return 0;
  return pMod->pModule->xShadowName(zName+nName+1);
}